

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void * __thiscall glcts::anon_unknown_0::UniformValue::getPtr(UniformValue *this,int arrayElement)

{
  GLenum GVar1;
  pair<int,_int> pVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int iStack_2c;
  int local_28;
  int arrayElementSize;
  int arrayElement_local;
  UniformValue *this_local;
  
  pVar2 = UniformType::getSize(&this->type);
  local_28 = pVar2.first;
  pVar2 = UniformType::getSize(&this->type);
  iStack_2c = pVar2.second;
  local_28 = local_28 * iStack_2c;
  GVar1 = UniformType::getBaseType(&this->type);
  if ((GVar1 == 0x1404) || (GVar1 = UniformType::getBaseType(&this->type), GVar1 == 0x82e6)) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->iValues,(long)(arrayElement * local_28));
    return pvVar3;
  }
  GVar1 = UniformType::getBaseType(&this->type);
  if (GVar1 == 0x1405) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->uValues,(long)(arrayElement * local_28));
    return pvVar3;
  }
  GVar1 = UniformType::getBaseType(&this->type);
  if (GVar1 == 0x1406) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->fValues,(long)(arrayElement * local_28));
    return pvVar4;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x253,"const void *glcts::(anonymous namespace)::UniformValue::getPtr(int) const");
}

Assistant:

const void* getPtr(int arrayElement) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;
		if (type.getBaseType() == GL_INT || type.getBaseType() == GL_SAMPLER)
		{
			return &iValues[arrayElement * arrayElementSize];
		}
		else if (type.getBaseType() == GL_UNSIGNED_INT)
		{
			return &uValues[arrayElement * arrayElementSize];
		}
		else if (type.getBaseType() == GL_FLOAT)
		{
			return &fValues[arrayElement * arrayElementSize];
		}
		assert(0);
		return NULL;
	}